

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int parse_zlib(zbuf *a,int parse_header)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int type;
  int final;
  int parse_header_local;
  zbuf *a_local;
  
  if ((parse_header == 0) || (iVar1 = parse_zlib_header(a), iVar1 != 0)) {
    a->num_bits = 0;
    a->code_buffer = 0;
    do {
      uVar2 = zreceive(a,1);
      uVar3 = zreceive(a,2);
      if (uVar3 == 0) {
        iVar1 = parse_uncompressed_block(a);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        if (uVar3 == 3) {
          return 0;
        }
        if (uVar3 == 1) {
          if (default_distance[0x1f] == '\0') {
            init_defaults();
          }
          iVar1 = zbuild_huffman(&a->z_length,default_length,0x120);
          if (iVar1 == 0) {
            return 0;
          }
          iVar1 = zbuild_huffman(&a->z_distance,default_distance,0x20);
          if (iVar1 == 0) {
            return 0;
          }
        }
        else {
          iVar1 = compute_huffman_codes(a);
          if (iVar1 == 0) {
            return 0;
          }
        }
        iVar1 = parse_huffman_block(a);
        if (iVar1 == 0) {
          return 0;
        }
      }
    } while (uVar2 == 0);
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int parse_zlib(zbuf *a, int parse_header)
{
   int final, type;
   if (parse_header)
      if (!parse_zlib_header(a)) return 0;
   a->num_bits = 0;
   a->code_buffer = 0;
   do {
      final = zreceive(a,1);
      type = zreceive(a,2);
      if (type == 0) {
         if (!parse_uncompressed_block(a)) return 0;
      } else if (type == 3) {
         return 0;
      } else {
         if (type == 1) {
            // use fixed code lengths
            if (!default_distance[31]) init_defaults();
            if (!zbuild_huffman(&a->z_length  , default_length  , 288)) return 0;
            if (!zbuild_huffman(&a->z_distance, default_distance,  32)) return 0;
         } else {
            if (!compute_huffman_codes(a)) return 0;
         }
         if (!parse_huffman_block(a)) return 0;
      }
   } while (!final);
   return 1;
}